

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

WriteThirdPartyDescriptorResult * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::writeThirdPartyDescriptor
          (WriteThirdPartyDescriptorResult *__return_storage_ptr__,DeferredThirdPartyClient *this,
          Connection *provider,Connection *recipient,Builder contact)

{
  void *pvVar1;
  int iVar2;
  ClientHook *pCVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 *local_1e8;
  long lStack_1e0;
  OneOf<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>,_kj::Own<capnp::AnyPointer::Reader,_std::nullptr_t>_>
  local_1d8;
  Exception local_1c0;
  
  if (((this->state).tag == 1) &&
     (iVar2 = (*provider->_vptr_Connection[9])(provider), (char)iVar2 != '\0')) {
    (*provider->_vptr_Connection[10])(provider,recipient);
    (**(code **)(**(long **)((long)&(this->state).field_1 + 0x18) + 0x20))(&local_1c0);
    clone<capnp::AnyPointer::Reader&,capnp::AnyPointer>
              ((capnp *)&local_1e8,*(Reader **)((long)&(this->state).field_1 + 8));
    local_1d8.tag = 2;
    local_1d8.field_1._0_8_ = local_1e8;
    local_1d8.field_1._8_8_ = lStack_1e0;
    lStack_1e0 = 0;
    kj::heap<capnp::_::RpcSystemBase::RpcConnectionState::VineInfo>
              ((kj *)&local_1f8,(VineInfo *)&local_1d8);
    __return_storage_ptr__->tag = 1;
    *(char **)&__return_storage_ptr__->field_1 = local_1c0.ownFile.content.ptr;
    *(size_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_1c0.ownFile.content.size_;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = local_1f8;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x18) = local_1f0;
    local_1c0.file = (char *)0x0;
    local_1c0.ownFile.content.size_ = 0;
    local_1f0 = 0;
    kj::
    OneOf<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>,_kj::Own<capnp::AnyPointer::Reader,_std::nullptr_t>_>
    ::destroy(&local_1d8);
    if (lStack_1e0 != 0) {
      lStack_1e0 = 0;
      (**(code **)*local_1e8)();
    }
  }
  else {
    pCVar3 = ensureAccepted(this);
    if ((RpcSystemBrand *)pCVar3->brand ==
        (((this->super_RpcClient).connectionState.ptr)->brand).ptr) {
      pvVar1 = pCVar3[2].brand;
      if (*(int *)((long)pvVar1 + 0x20) == 2) {
        kj::Exception::Exception(&local_1c0,(Exception *)((long)pvVar1 + 0x28));
        newBrokenCap((capnp *)&local_1d8,&local_1c0);
        __return_storage_ptr__->tag = 2;
        *(ulong *)&__return_storage_ptr__->field_1 = CONCAT44(local_1d8._4_4_,local_1d8.tag);
        *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 8) = local_1d8.field_1._0_8_;
        local_1d8.field_1._0_8_ = 0;
        kj::Exception::~Exception(&local_1c0);
      }
      else {
        if (*(int *)((long)pvVar1 + 0x20) != 1) {
          kj::_::unreachable();
        }
        (*pCVar3->_vptr_ClientHook[0xc])
                  (__return_storage_ptr__,pCVar3,*(undefined8 *)((long)pvVar1 + 0x38),recipient,
                   in_R8,in_R9,contact.builder.segment._0_4_,contact.builder.capTable._0_4_,
                   contact.builder.pointer);
      }
    }
    else {
      (*pCVar3->_vptr_ClientHook[4])(&local_1c0,pCVar3);
      __return_storage_ptr__->tag = 2;
      *(char **)&__return_storage_ptr__->field_1 = local_1c0.ownFile.content.ptr;
      *(size_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_1c0.ownFile.content.size_;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

WriteThirdPartyDescriptorResult writeThirdPartyDescriptor(
          VatNetworkBase::Connection& provider,
          VatNetworkBase::Connection& recipient,
          AnyPointer::Builder contact) override {
      if (state.is<Deferred>() &&
          provider.canForwardThirdPartyToContact(*state.get<Deferred>().contact, recipient)) {
        // We have not accepted this capability yet, and the VatNetwork supports forwarding it!
        // We can get away without accepting the capability.
        auto& deferred = state.get<Deferred>();
        provider.forwardThirdPartyToContact(*deferred.contact, recipient, contact);

        return VineToExport {
          .vine = deferred.vine->addRef(),
          .vineInfo = kj::heap(VineInfo {.info = capnp::clone(*deferred.contact)}),
        };
      } else {
        // Either:
        // a. We already accepted this cap, so we should treat this as a normal three-party handoff
        //    and hand off the cap we accepted. (Actually, this doesn't happen in practice because
        //    the caller would already have resolved to the inner capability in this case.)
        // b. The VatNetwork won't allow forwarding, so we must accept the cap first, and then,
        //    again, hand off the accepted cap.
        auto& hook = ensureAccepted();
        KJ_IF_SOME(rpcHook, connectionState->unwrapIfSameNetwork(hook)) {
          KJ_SWITCH_ONEOF(rpcHook.connectionState->connection) {
            KJ_CASE_ONEOF(connected, Connected) {
              // Common case: the accepted capability is on its own connection, which we're still
              // connected to.
              return rpcHook.writeThirdPartyDescriptor(*connected.connection, recipient, contact);
            }
            KJ_CASE_ONEOF(error, Disconnected) {
              // We accepted the capability but the connection we accepted it on is now dead.
              // Don't fill in `contact` and just return a broken cap.
              return newBrokenCap(kj::cp(error));
            }
          }
          KJ_UNREACHABLE;
        } else {
          // Apparently, when we accepted the capability, it turned out to be a self-introduction
          // and now we're left with a capability pointing into our own vat. We need to return
          // that instead.
          return hook.addRef();
        }
      }